

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void __thiscall
polyscope::Histogram::buildHistogram
          (Histogram *this,vector<double,_std::allocator<double>_> *values,
          vector<double,_std::allocator<double>_> *weights)

{
  pointer pdVar1;
  pointer pdVar2;
  logic_error *this_00;
  long lVar3;
  bool bVar4;
  pair<double,_double> pVar5;
  size_t N;
  anon_class_32_4_d64c7edc buildCurve;
  
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = pdVar1 != pdVar2;
  this->hasWeighted = bVar4;
  this->useWeighted = bVar4;
  lVar3 = (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  N = lVar3 >> 3;
  if ((long)pdVar1 - (long)pdVar2 == lVar3 || !bVar4) {
    pVar5 = robustMinMax<double>(values,1e-12);
    buildCurve.N = &N;
    this->dataRange = pVar5;
    this->colormapRange = pVar5;
    buildCurve.this = this;
    buildCurve.values = values;
    buildCurve.weights = weights;
    buildHistogram::anon_class_32_4_d64c7edc::operator()
              (&buildCurve,this->rawHistBinCount,false,false,&this->rawHistCurveX,
               &this->unweightedRawHistCurveY);
    buildHistogram::anon_class_32_4_d64c7edc::operator()
              (&buildCurve,this->smoothedHistBinCount,false,true,&this->smoothedHistCurveX,
               &this->unweightedSmoothedHistCurveY);
    if (this->hasWeighted == true) {
      buildHistogram::anon_class_32_4_d64c7edc::operator()
                (&buildCurve,this->rawHistBinCount,true,false,&this->rawHistCurveX,
                 &this->weightedRawHistCurveY);
      buildHistogram::anon_class_32_4_d64c7edc::operator()
                (&buildCurve,this->smoothedHistBinCount,true,true,&this->smoothedHistCurveX,
                 &this->weightedSmoothedHistCurveY);
    }
    fillBuffers(this);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"values and weights are not same size");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Histogram::buildHistogram(std::vector<double>& values, const std::vector<double>& weights) {

  hasWeighted = weights.size() > 0;
  useWeighted = hasWeighted;

  // Build weighed and unweighted arrays of values
  size_t N = values.size();
  if (weights.size() != 0 && weights.size() != N) {
    throw std::logic_error("values and weights are not same size");
  }

  // == Build histogram
  dataRange = robustMinMax(values);
  colormapRange = dataRange;

  // Helper to build the four histogram variants
  auto buildCurve = [&](size_t binCount, bool weighted, bool smooth, std::vector<std::array<double, 2>>& curveX,
                        std::vector<double>& curveY) {
    // linspace coords
    double range = dataRange.second - dataRange.first;
    double inc = range / binCount;
    std::vector<double> sumBin(binCount, 0.0);

    // count values in buckets
    for (size_t iData = 0; iData < N; iData++) {

      double iBinf = binCount * (values[iData] - dataRange.first) / range;
      size_t iBin = std::floor(glm::clamp(iBinf, 0.0, (double)binCount - 1));

      // NaN values and finite values near the bottom of float range lead to craziness, so only increment bins if we got
      // something reasonable
      if (iBin < binCount) {
        if (weighted) {
          sumBin[iBin] += weights[iData];
        } else {
          sumBin[iBin] += 1.0;
        }
      }
    }


    // build histogram coords
    curveX = std::vector<std::array<double, 2>>(binCount);
    curveY = std::vector<double>(binCount);
    double prevSumU = 0.0;
    double prevSumW = 0.0;
    double prevXEnd = dataRange.first;
    for (size_t iBin = 0; iBin < binCount; iBin++) {
      // y value
      curveY[iBin] = sumBin[iBin];

      // x value
      double xEnd = prevXEnd + inc;
      curveX[iBin] = {{prevXEnd, xEnd}};
      prevXEnd = xEnd;
    }

    { // Rescale curves to [0,1] in both dimensions
      double maxHeight = *std::max_element(curveY.begin(), curveY.end());
      for (size_t i = 0; i < binCount; i++) {
        curveX[i][0] = (curveX[i][0] - dataRange.first) / range;
        curveX[i][1] = (curveX[i][1] - dataRange.first) / range;
        curveY[i] /= maxHeight;
      }
    }

    if (smooth) {
      smoothCurve(curveX, curveY);

      { // Rescale again after smoothing
        double maxHeight = *std::max_element(curveY.begin(), curveY.end());
        for (size_t i = 0; i < binCount; i++) {
          curveY[i] /= maxHeight;
        }
      }
    }
  };

  // Build the four variants of the curve
  buildCurve(rawHistBinCount, false, false, rawHistCurveX, unweightedRawHistCurveY);
  buildCurve(smoothedHistBinCount, false, true, smoothedHistCurveX, unweightedSmoothedHistCurveY);
  if (hasWeighted) {
    buildCurve(rawHistBinCount, true, false, rawHistCurveX, weightedRawHistCurveY);
    buildCurve(smoothedHistBinCount, true, true, smoothedHistCurveX, weightedSmoothedHistCurveY);
  }


  fillBuffers();
}